

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O1

unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
__thiscall duckdb::ColumnCountScanner::UpgradeToStringValueScanner(ColumnCountScanner *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  CSVStateMachine *pCVar2;
  CSVStateMachine *pCVar3;
  StringValueScanner *pSVar4;
  ulong rows_to_skip;
  long in_RSI;
  shared_ptr<duckdb::CSVBufferManager,_true> local_e8;
  shared_ptr<duckdb::CSVFileScan,_true> local_d8;
  CSVIterator it;
  CSVIterator iterator;
  
  this_00 = (shared_ptr<duckdb::CSVStateMachine,_true> *)(in_RSI + 0x30);
  pCVar2 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  pCVar3 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  uVar1 = (pCVar2->dialect_options).skip_rows.value;
  rows_to_skip = (pCVar3->dialect_options).rows_until_header;
  if (rows_to_skip < uVar1) {
    rows_to_skip = uVar1;
  }
  local_e8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = *(element_type **)(in_RSI + 0x48);
  local_e8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x50);
  if (local_e8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_e8.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_e8.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  BaseScanner::SkipCSVRows(&iterator,&local_e8,this_00,rows_to_skip);
  if (local_e8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (iterator.done == true) {
    CSVIterator::CSVIterator(&it);
    pSVar4 = (StringValueScanner *)operator_new(0x4c8);
    local_d8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_d8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    StringValueScanner::StringValueScanner
              (pSVar4,0,(shared_ptr<duckdb::CSVBufferManager,_true> *)(in_RSI + 0x48),this_00,
               (shared_ptr<duckdb::CSVErrorHandler,_true> *)(in_RSI + 0x20),&local_d8,true,&it,
               *(idx_t *)(in_RSI + 0x1c8));
    (this->super_BaseScanner)._vptr_BaseScanner = (_func_int **)pSVar4;
    this_01._M_pi =
         local_d8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  else {
    pSVar4 = (StringValueScanner *)operator_new(0x4c8);
    it.pos.buffer_idx = 0;
    it.pos.buffer_pos = 0;
    StringValueScanner::StringValueScanner
              (pSVar4,0,(shared_ptr<duckdb::CSVBufferManager,_true> *)(in_RSI + 0x48),this_00,
               (shared_ptr<duckdb::CSVErrorHandler,_true> *)(in_RSI + 0x20),
               (shared_ptr<duckdb::CSVFileScan,_true> *)&it,true,&iterator,
               *(idx_t *)(in_RSI + 0x1c8));
    (this->super_BaseScanner)._vptr_BaseScanner = (_func_int **)pSVar4;
    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)it.pos.buffer_pos;
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  return (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>)
         (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>)
         this;
}

Assistant:

unique_ptr<StringValueScanner> ColumnCountScanner::UpgradeToStringValueScanner() {
	idx_t rows_to_skip =
	    std::max(state_machine->dialect_options.skip_rows.GetValue(), state_machine->dialect_options.rows_until_header);
	auto iterator = SkipCSVRows(buffer_manager, state_machine, rows_to_skip);
	if (iterator.done) {
		CSVIterator it {};
		return make_uniq<StringValueScanner>(0U, buffer_manager, state_machine, error_handler, nullptr, true, it,
		                                     result_size);
	}
	return make_uniq<StringValueScanner>(0U, buffer_manager, state_machine, error_handler, nullptr, true, iterator,
	                                     result_size);
}